

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTcPrsNode * __thiscall
CTPNVarInRangeBase::fold_constants(CTPNVarInRangeBase *this,CTcPrsSymtab *symtab)

{
  CTcPrsNode *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar2 = (*(this->lval_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])();
  this->lval_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(this->from_expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])
                    (this->from_expr_,symtab);
  this->from_expr_ = (CTcPrsNode *)CONCAT44(extraout_var_00,iVar2);
  iVar2 = (*(this->to_expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])(this->to_expr_,symtab)
  ;
  this->to_expr_ = (CTcPrsNode *)CONCAT44(extraout_var_01,iVar2);
  pCVar1 = this->step_expr_;
  if (pCVar1 != (CTcPrsNode *)0x0) {
    iVar2 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])(pCVar1,symtab);
    this->step_expr_ = (CTcPrsNode *)CONCAT44(extraout_var_02,iVar2);
  }
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTPNVarInRangeBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold each element */
    lval_ = lval_->fold_constants(symtab);
    from_expr_ = from_expr_->fold_constants(symtab);
    to_expr_ = to_expr_->fold_constants(symtab);
    if (step_expr_ != 0)
        step_expr_ = step_expr_->fold_constants(symtab);

    /* we can't fold the overall 'in' expression itself */
    return this;
}